

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# obj-init.c
# Opt level: O1

parser_error parse_ego_min_val(parser *p)

{
  _Bool _Var1;
  errr eVar2;
  parser_error pVar3;
  void *pvVar4;
  char *pcVar5;
  char *name_and_value;
  
  pvVar4 = parser_priv(p);
  if (pvVar4 == (void *)0x0) {
    pVar3 = PARSE_ERROR_MISSING_RECORD_HEADER;
  }
  else {
    _Var1 = parser_hasval(p,"min_values");
    pVar3 = PARSE_ERROR_MISSING_FIELD;
    if (_Var1) {
      pcVar5 = parser_getstr(p,"min_values");
      pcVar5 = string_make(pcVar5);
      name_and_value = strtok(pcVar5," |");
      while (name_and_value != (char *)0x0) {
        eVar2 = grab_int_value((int16_t *)((long)pvVar4 + 0x140),obj_mods,name_and_value);
        if (eVar2 != 0) goto LAB_0019f411;
        name_and_value = strtok((char *)0x0," |");
      }
      name_and_value = (char *)0x0;
LAB_0019f411:
      string_free(pcVar5);
      pVar3 = PARSE_ERROR_INVALID_VALUE;
      if (name_and_value == (char *)0x0) {
        pVar3 = PARSE_ERROR_NONE;
      }
    }
  }
  return pVar3;
}

Assistant:

static enum parser_error parse_ego_min_val(struct parser *p) {
	struct ego_item *e = parser_priv(p);
	char *s, *t;

	if (!e) {
		return PARSE_ERROR_MISSING_RECORD_HEADER;
	}
	if (!parser_hasval(p, "min_values")) {
		return PARSE_ERROR_MISSING_FIELD;
	}

	s = string_make(parser_getstr(p, "min_values"));
	t = strtok(s, " |");

	while (t) {
		bool found = false;
		if (!grab_int_value(e->min_modifiers, obj_mods, t)) {
			found = true;
		}
		if (!found) {
			break;
		}
		t = strtok(NULL, " |");
	}

	string_free(s);
	return t ? PARSE_ERROR_INVALID_VALUE : PARSE_ERROR_NONE;
}